

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmwCmpxchg<unsigned_int,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  ulong uVar1;
  pointer puVar2;
  Store *this_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  unsigned_long uVar6;
  RunResult RVar7;
  ulong uVar8;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  uVar3 = Pop<unsigned_int>(this);
  uVar4 = Pop<unsigned_int>(this);
  if (((local_80.obj_)->type_).limits.is_64 == true) {
    uVar6 = Pop<unsigned_long>(this);
  }
  else {
    uVar5 = Pop<unsigned_int>(this);
    uVar6 = (unsigned_long)uVar5;
  }
  puVar2 = ((local_80.obj_)->data_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)((local_80.obj_)->data_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if ((((uVar8 < 4) || (uVar8 < uVar6)) || (uVar8 < instr.field_2.imm_u32x2.snd)) ||
     ((uVar1 = uVar6 + instr.field_2.imm_u32x2.snd, (uVar1 & 3) != 0 || (uVar8 < uVar1 + 4)))) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_(&local_68,"invalid atomic access at %lu+%u");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    RVar7 = Trap;
  }
  else {
    uVar5 = *(uint *)(puVar2 + uVar1);
    if (uVar5 == uVar4) {
      *(uint *)(puVar2 + uVar1) = uVar3;
    }
    Push<unsigned_int>(this,uVar5);
    RVar7 = Ok;
  }
  if (local_80.obj_ != (Memory *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_80.store_)->roots_,local_80.root_index_);
  }
  return RVar7;
}

Assistant:

RunResult Thread::DoAtomicRmwCmpxchg(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V replace = static_cast<V>(Pop<T>());
  V expect = static_cast<V>(Pop<T>());
  V old;
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->AtomicRmwCmpxchg(offset, instr.imm_u32x2.snd, expect,
                                          replace, &old)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<T>(old));
  return RunResult::Ok;
}